

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus DVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  byte in_R8B;
  MCInst *in_R9;
  uint simm13;
  uint rs2;
  _Bool isImm;
  uint rs1;
  uint rd;
  DecodeStatus status;
  uint uVar5;
  uint32_t uVar6;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar7;
  uint in_stack_ffffffffffffffc4;
  DecodeStatus local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,0x19,5);
  uVar2 = fieldFromInstruction_4(in_ESI,0xe,5);
  uVar3 = fieldFromInstruction_4(in_ESI,0xd,1);
  uVar7 = CONCAT13(uVar3 != 0,(int3)in_stack_ffffffffffffffb8);
  uVar6 = 0;
  uVar5 = 0;
  if (uVar3 != 0) {
    uVar3 = fieldFromInstruction_4(in_ESI,0,0xd);
    uVar5 = SignExtend32(uVar3,0xd);
  }
  else {
    uVar6 = fieldFromInstruction_4(in_ESI,0,5);
  }
  if ((in_R8B & 1) != 0) {
    DVar4 = (*(code *)in_R9)(in_RDI,uVar1,in_RDX,in_RCX);
    if (DVar4 != MCDisassembler_Success) {
      return DVar4;
    }
    in_stack_ffffffffffffffc4 = 3;
  }
  local_4 = DecodeIntRegsRegisterClass
                      (in_R9,in_stack_ffffffffffffffc4,CONCAT44(uVar2,uVar7),
                       (void *)CONCAT44(uVar6,uVar5));
  if (local_4 == MCDisassembler_Success) {
    if ((uVar7 & 0x1000000) == 0) {
      DVar4 = DecodeIntRegsRegisterClass
                        (in_R9,3,CONCAT44(uVar2,uVar7),(void *)CONCAT44(uVar6,uVar5));
      if (DVar4 != MCDisassembler_Success) {
        return DVar4;
      }
    }
    else {
      MCOperand_CreateImm0(in_RDI,(ulong)uVar5);
    }
    if (((in_R8B & 1) != 0) ||
       (local_4 = (*(code *)in_R9)(in_RDI,uVar1,in_RDX,in_RCX), local_4 == MCDisassembler_Success))
    {
      local_4 = MCDisassembler_Success;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder,
		bool isLoad, DecodeFunc DecodeRD)
{
	DecodeStatus status;
	unsigned rd = fieldFromInstruction_4(insn, 25, 5);
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	bool isImm = fieldFromInstruction_4(insn, 13, 1) != 0;
	unsigned rs2 = 0;
	unsigned simm13 = 0;

	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	if (isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	// Decode rs1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode imm|rs2.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	if (!isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}